

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exhaustive-solver.hpp
# Opt level: O3

void __thiscall
baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,double>::operator()
          (exhaustive_solver<baryonyx::itm::maximize_tag,double> *this,int k,
          vector<cst,_std::allocator<cst>_> *constraint_elements,int bk_min,int bk_max)

{
  exhaustive_solver<baryonyx::itm::maximize_tag,double> *this_00;
  iterator __position;
  bool bVar1;
  undefined8 uVar2;
  byte bVar3;
  byte bVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  int j;
  ushort uVar10;
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  int nb_solution;
  int start_it_flat_constraints;
  uint local_b8;
  uint local_b4;
  ulong local_b0;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  vector<cst,_std::allocator<cst>_> *local_90;
  ulong local_88;
  exhaustive_solver<baryonyx::itm::maximize_tag,double> *local_80;
  undefined1 local_78 [64];
  undefined1 auVar11 [16];
  
  uVar7 = (long)(constraint_elements->super__Vector_base<cst,_std::allocator<cst>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(constraint_elements->super__Vector_base<cst,_std::allocator<cst>_>)._M_impl.
                super__Vector_impl_data._M_start;
  local_b4 = 0;
  uVar6 = (ulong)(*(long *)(this + 0x20) - *(long *)(this + 0x18)) >> 2;
  local_a0 = (int)uVar6;
  local_a4 = bk_min;
  local_9c = bk_max;
  local_98 = bk_min;
  local_94 = k;
  local_90 = constraint_elements;
  if (k < 0) {
    operator()();
  }
  else {
    uVar9 = (uint)(uVar7 >> 2);
    if (0 < (int)uVar9) {
      local_80 = this + 0x18;
      this_00 = this + 0x30;
      local_b8 = local_b8 & 0xffffff00;
      local_88 = uVar6;
      std::vector<signed_char,_std::allocator<signed_char>_>::resize
                ((vector<signed_char,_std::allocator<signed_char>_> *)this_00,(long)uVar7 >> 2,
                 (value_type_conflict *)&local_b8);
      auVar14 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar15 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      local_b0 = 0;
      auVar16 = vpbroadcastq_avx512f();
      local_78 = vmovdqu64_avx512f(auVar16);
      *(undefined1 *)(*(long *)(this + 0x38) + -1) = 1;
      lVar5 = *(long *)(this + 0x30);
      local_a8 = bk_max;
      do {
        lVar8 = (long)(*(int *)(this + 0x38) - (int)lVar5);
        while( true ) {
          lVar5 = *(long *)this_00;
          auVar20 = ZEXT1664((undefined1  [16])0x0);
          uVar6 = 0;
          do {
            auVar17 = vpbroadcastq_avx512f();
            auVar18 = vmovdqa64_avx512f(auVar20);
            auVar20 = vporq_avx512f(auVar17,auVar14);
            auVar17 = vporq_avx512f(auVar17,auVar15);
            uVar2 = vpcmpuq_avx512f(auVar17,auVar16,2);
            bVar3 = (byte)uVar2;
            uVar2 = vpcmpuq_avx512f(auVar20,auVar16,2);
            bVar4 = (byte)uVar2;
            uVar10 = CONCAT11(bVar4,bVar3);
            auVar11 = vmovdqu8_avx512vl(*(undefined1 (*) [16])(lVar5 + uVar6));
            auVar12[1] = ((byte)(uVar10 >> 1) & 1) * auVar11[1];
            auVar12[0] = (bVar3 & 1) * auVar11[0];
            auVar12[2] = ((byte)(uVar10 >> 2) & 1) * auVar11[2];
            auVar12[3] = ((byte)(uVar10 >> 3) & 1) * auVar11[3];
            auVar12[4] = ((byte)(uVar10 >> 4) & 1) * auVar11[4];
            auVar12[5] = ((byte)(uVar10 >> 5) & 1) * auVar11[5];
            auVar12[6] = ((byte)(uVar10 >> 6) & 1) * auVar11[6];
            auVar12[7] = ((byte)(uVar10 >> 7) & 1) * auVar11[7];
            auVar12[8] = (bVar4 & 1) * auVar11[8];
            auVar12[9] = (bVar4 >> 1 & 1) * auVar11[9];
            auVar12[10] = (bVar4 >> 2 & 1) * auVar11[10];
            auVar12[0xb] = (bVar4 >> 3 & 1) * auVar11[0xb];
            auVar12[0xc] = (bVar4 >> 4 & 1) * auVar11[0xc];
            auVar12[0xd] = (bVar4 >> 5 & 1) * auVar11[0xd];
            auVar12[0xe] = (bVar4 >> 6 & 1) * auVar11[0xe];
            auVar12[0xf] = -((char)bVar4 >> 7) * auVar11[0xf];
            uVar7 = vptestmb_avx512vl(auVar12,auVar12);
            uVar7 = uVar10 & uVar7;
            auVar20 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                         ((local_90->super__Vector_base<cst,_std::allocator<cst>_>).
                                          _M_impl.super__Vector_impl_data._M_start + uVar6));
            auVar17._4_4_ = (uint)((byte)(uVar7 >> 1) & 1) * auVar20._4_4_;
            auVar17._0_4_ = (uint)((byte)uVar7 & 1) * auVar20._0_4_;
            auVar17._8_4_ = (uint)((byte)(uVar7 >> 2) & 1) * auVar20._8_4_;
            auVar17._12_4_ = (uint)((byte)(uVar7 >> 3) & 1) * auVar20._12_4_;
            auVar17._16_4_ = (uint)((byte)(uVar7 >> 4) & 1) * auVar20._16_4_;
            auVar17._20_4_ = (uint)((byte)(uVar7 >> 5) & 1) * auVar20._20_4_;
            auVar17._24_4_ = (uint)((byte)(uVar7 >> 6) & 1) * auVar20._24_4_;
            auVar17._28_4_ = (uint)((byte)(uVar7 >> 7) & 1) * auVar20._28_4_;
            auVar17._32_4_ = (uint)((byte)(uVar7 >> 8) & 1) * auVar20._32_4_;
            auVar17._36_4_ = (uint)((byte)(uVar7 >> 9) & 1) * auVar20._36_4_;
            auVar17._40_4_ = (uint)((byte)(uVar7 >> 10) & 1) * auVar20._40_4_;
            auVar17._44_4_ = (uint)((byte)(uVar7 >> 0xb) & 1) * auVar20._44_4_;
            auVar17._48_4_ = (uint)((byte)(uVar7 >> 0xc) & 1) * auVar20._48_4_;
            auVar17._52_4_ = (uint)((byte)(uVar7 >> 0xd) & 1) * auVar20._52_4_;
            auVar17._56_4_ = (uint)((byte)(uVar7 >> 0xe) & 1) * auVar20._56_4_;
            auVar17._60_4_ = (uint)(byte)(uVar7 >> 0xf) * auVar20._60_4_;
            uVar6 = uVar6 + 0x10;
            auVar20 = vpaddd_avx512f(auVar18,auVar17);
          } while ((uVar9 + 0xf & 0xfffffff0) != uVar6);
          auVar20 = vmovdqa32_avx512f(auVar20);
          auVar19._0_4_ =
               (uint)(bVar3 & 1) * auVar20._0_4_ | (uint)!(bool)(bVar3 & 1) * auVar18._0_4_;
          bVar1 = (bool)((byte)(uVar10 >> 1) & 1);
          auVar19._4_4_ = (uint)bVar1 * auVar20._4_4_ | (uint)!bVar1 * auVar18._4_4_;
          bVar1 = (bool)((byte)(uVar10 >> 2) & 1);
          auVar19._8_4_ = (uint)bVar1 * auVar20._8_4_ | (uint)!bVar1 * auVar18._8_4_;
          bVar1 = (bool)((byte)(uVar10 >> 3) & 1);
          auVar19._12_4_ = (uint)bVar1 * auVar20._12_4_ | (uint)!bVar1 * auVar18._12_4_;
          bVar1 = (bool)((byte)(uVar10 >> 4) & 1);
          auVar19._16_4_ = (uint)bVar1 * auVar20._16_4_ | (uint)!bVar1 * auVar18._16_4_;
          bVar1 = (bool)((byte)(uVar10 >> 5) & 1);
          auVar19._20_4_ = (uint)bVar1 * auVar20._20_4_ | (uint)!bVar1 * auVar18._20_4_;
          bVar1 = (bool)((byte)(uVar10 >> 6) & 1);
          auVar19._24_4_ = (uint)bVar1 * auVar20._24_4_ | (uint)!bVar1 * auVar18._24_4_;
          bVar1 = (bool)((byte)(uVar10 >> 7) & 1);
          auVar19._28_4_ = (uint)bVar1 * auVar20._28_4_ | (uint)!bVar1 * auVar18._28_4_;
          auVar19._32_4_ =
               (uint)(bVar4 & 1) * auVar20._32_4_ | (uint)!(bool)(bVar4 & 1) * auVar18._32_4_;
          bVar1 = (bool)(bVar4 >> 1 & 1);
          auVar19._36_4_ = (uint)bVar1 * auVar20._36_4_ | (uint)!bVar1 * auVar18._36_4_;
          bVar1 = (bool)(bVar4 >> 2 & 1);
          auVar19._40_4_ = (uint)bVar1 * auVar20._40_4_ | (uint)!bVar1 * auVar18._40_4_;
          bVar1 = (bool)(bVar4 >> 3 & 1);
          auVar19._44_4_ = (uint)bVar1 * auVar20._44_4_ | (uint)!bVar1 * auVar18._44_4_;
          bVar1 = (bool)(bVar4 >> 4 & 1);
          auVar19._48_4_ = (uint)bVar1 * auVar20._48_4_ | (uint)!bVar1 * auVar18._48_4_;
          bVar1 = (bool)(bVar4 >> 5 & 1);
          auVar19._52_4_ = (uint)bVar1 * auVar20._52_4_ | (uint)!bVar1 * auVar18._52_4_;
          bVar1 = (bool)(bVar4 >> 6 & 1);
          auVar19._56_4_ = (uint)bVar1 * auVar20._56_4_ | (uint)!bVar1 * auVar18._56_4_;
          auVar19._60_4_ =
               (uint)(bVar4 >> 7) * auVar20._60_4_ | (uint)!(bool)(bVar4 >> 7) * auVar18._60_4_;
          auVar13 = vextracti64x4_avx512f(auVar19,1);
          auVar20 = vpaddd_avx512f(auVar19,ZEXT3264(auVar13));
          auVar11 = vpaddd_avx(auVar20._0_16_,auVar20._16_16_);
          auVar12 = vpshufd_avx(auVar11,0xee);
          auVar11 = vpaddd_avx(auVar11,auVar12);
          auVar12 = vpshufd_avx(auVar11,0x55);
          auVar11 = vpaddd_avx(auVar11,auVar12);
          if (auVar11._0_4_ <= bk_max && local_a4 <= auVar11._0_4_) {
            uVar6 = 0;
            local_b4 = (int)local_b0 + 1;
            local_b0 = (ulong)local_b4;
            do {
              if (*(char *)(*(long *)this_00 + uVar6) == '\0') {
                local_b8 = 0;
              }
              else {
                local_b8 = (local_90->super__Vector_base<cst,_std::allocator<cst>_>)._M_impl.
                           super__Vector_impl_data._M_start[uVar6].factor;
              }
              __position._M_current = *(int **)(this + 0x20);
              if (__position._M_current == *(int **)(this + 0x28)) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          ((vector<int,_std::allocator<int>_> *)local_80,__position,(int *)&local_b8
                          );
                auVar15 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                auVar14 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                auVar16 = vmovdqu64_avx512f(local_78);
              }
              else {
                *__position._M_current = local_b8;
                *(int **)(this + 0x20) = __position._M_current + 1;
              }
              uVar6 = uVar6 + 1;
            } while ((uVar9 & 0x7fffffff) != uVar6);
            lVar5 = *(long *)this_00;
            bk_max = local_a8;
          }
          lVar8 = lVar8 + -1;
          *(char *)(lVar5 + lVar8) = *(char *)(lVar5 + lVar8) + '\x01';
          lVar5 = *(long *)this_00;
          if (*(char *)(lVar5 + lVar8) < '\x02') break;
          *(undefined1 *)(lVar5 + lVar8) = 0;
          if (lVar8 == 0) {
            if ((int)local_88 < 0) goto LAB_00107c10;
            if (0 < (int)local_b0) {
              std::
              _Rb_tree<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,double>::constraint,baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,double>::constraint,std::_Identity<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,double>::constraint>,std::less<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,double>::constraint>,std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,double>::constraint>>
              ::_M_emplace_unique<int&,int_const&,int&,int&,int&>
                        ((_Rb_tree<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,double>::constraint,baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,double>::constraint,std::_Identity<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,double>::constraint>,std::less<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,double>::constraint>,std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,double>::constraint>>
                          *)(this + 0x48),&local_94,&local_a0,(int *)&local_b4,&local_98,&local_9c);
              return;
            }
            goto LAB_00107c18;
          }
        }
      } while( true );
    }
  }
  operator()();
LAB_00107c10:
  operator()();
LAB_00107c18:
  operator()();
}

Assistant:

void build_constraints(int k,
                           const C& constraint_elements,
                           int bk_min,
                           int bk_max)
    {
        const auto constraint_size = length(constraint_elements);
        const auto start_it_flat_constraints = length(flat_constraints);
        auto nb_solution = 0;

        bx_ensures(k >= 0);
        bx_ensures(constraint_size > 0);

        walkers.resize(constraint_elements.size(), 0);
        walkers.back() = 1;
        bool end = false;

        do {
            auto i = length(walkers) - 1;

            do {
                int sum = 0;
                for (int j = 0; j != constraint_size; ++j)
                    if (walkers[j])
                        sum += constraint_elements[j].factor;

                if (bk_min <= sum && sum <= bk_max) {
                    ++nb_solution;
                    for (int j = 0; j != constraint_size; ++j) {
                        flat_constraints.emplace_back(
                          walkers[j] ? constraint_elements[j].factor : 0);
                    }
                }

                ++walkers[i];

                if (walkers[i] > 1) {
                    walkers[i] = 0;

                    if (i == 0) {
                        end = true;
                        break;
                    } else {
                        --i;
                    }
                } else {
                    break;
                }
            } while (!end);
        } while (!end);

        bx_expects(start_it_flat_constraints >= 0);
        bx_expects(nb_solution > 0);

        constraints.emplace(
          k, start_it_flat_constraints, nb_solution, bk_min, bk_max);
    }